

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypeDeclaration_Tag.cpp
# Opt level: O0

TagDeclarationCategory __thiscall psy::C::TagDeclarationSymbol::category(TagDeclarationSymbol *this)

{
  SymbolKind SVar1;
  ostream *poVar2;
  TagDeclarationSymbol *this_local;
  
  SVar1 = Symbol::kind((Symbol *)this);
  if (TypedefDeclaration < SVar1) {
    if ((byte)(SVar1 - StructDeclaration) < 2) {
      return StructOrUnion;
    }
    if (SVar1 == EnumDeclaration) {
      return Enum;
    }
  }
  poVar2 = std::operator<<((ostream *)&std::cout,"[ASSERT] at ");
  poVar2 = std::operator<<(poVar2,
                           "/workspace/llm4binary/github/license_c_cmakelists/ltcmelo[P]psychec/C/symbols/TypeDeclaration_Tag.cpp"
                          );
  poVar2 = std::operator<<(poVar2,":");
  poVar2 = (ostream *)std::ostream::operator<<(poVar2,0x43);
  poVar2 = std::operator<<(poVar2," ");
  poVar2 = std::operator<<(poVar2,"<empty message>");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  return ~StructOrUnion;
}

Assistant:

TagDeclarationCategory TagDeclarationSymbol::category() const
{
    switch (kind()) {
        case SymbolKind::Program:
        case SymbolKind::TranslationUnit:
        case SymbolKind::FunctionDeclaration:
        case SymbolKind::EnumeratorDeclaration:
        case SymbolKind::FieldDeclaration:
        case SymbolKind::VariableDeclaration:
        case SymbolKind::ParameterDeclaration:
        case SymbolKind::TypedefDeclaration:
            break;
        case SymbolKind::StructDeclaration:
        case SymbolKind::UnionDeclaration:
            return TagDeclarationCategory::StructOrUnion;
        case SymbolKind::EnumDeclaration:
            return TagDeclarationCategory::Enum;
    }
    PSY_ASSERT_1(false);
    return TagDeclarationCategory(~0);
}